

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

string * __thiscall
google::protobuf::Reflection::GetStringReference
          (Reflection *this,Message *message,FieldDescriptor *field,string *scratch)

{
  bool bVar1;
  Label LVar2;
  CppType CVar3;
  Descriptor *pDVar4;
  ArenaStringPtr *this_00;
  FieldDescriptor *in_RDX;
  long *in_RDI;
  char *in_stack_00000048;
  char *in_stack_00000050;
  undefined4 in_stack_00000058;
  CppType in_stack_0000005c;
  Descriptor *in_stack_00000060;
  string *in_stack_00000068;
  undefined4 in_stack_00000070;
  int in_stack_00000074;
  ExtensionSet *in_stack_00000078;
  FieldDescriptor *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  string *local_10;
  
  pDVar4 = FieldDescriptor::containing_type(in_RDX);
  if (pDVar4 != (Descriptor *)*in_RDI) {
    anon_unknown_0::ReportReflectionUsageError
              (in_stack_00000060,(FieldDescriptor *)CONCAT44(in_stack_0000005c,in_stack_00000058),
               in_stack_00000050,in_stack_00000048);
  }
  LVar2 = FieldDescriptor::label(in_RDX);
  if (LVar2 == LABEL_REPEATED) {
    anon_unknown_0::ReportReflectionUsageError
              (in_stack_00000060,(FieldDescriptor *)CONCAT44(in_stack_0000005c,in_stack_00000058),
               in_stack_00000050,in_stack_00000048);
  }
  CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)0x6d58ff);
  if (CVar3 != CPPTYPE_STRING) {
    anon_unknown_0::ReportReflectionUsageTypeError
              ((Descriptor *)CONCAT44(in_stack_00000074,in_stack_00000070),
               (FieldDescriptor *)in_stack_00000068,(char *)in_stack_00000060,in_stack_0000005c);
  }
  bVar1 = FieldDescriptor::is_extension(in_RDX);
  if (bVar1) {
    GetExtensionSet((Reflection *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                    (Message *)in_stack_ffffffffffffffb8);
    FieldDescriptor::number(in_RDX);
    FieldDescriptor::default_value_string_abi_cxx11_(in_RDX);
    local_10 = internal::ExtensionSet::GetString
                         (in_stack_00000078,in_stack_00000074,in_stack_00000068);
  }
  else {
    FieldDescriptor::options(in_RDX);
    FieldOptions::ctype((FieldOptions *)0x6d5986);
    bVar1 = IsInlined((Reflection *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      in_stack_ffffffffffffffb8);
    if (bVar1) {
      local_10 = (string *)
                 GetField<google::protobuf::internal::InlinedStringField>
                           ((Reflection *)
                            CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                            (Message *)in_stack_ffffffffffffffb8,(FieldDescriptor *)0x6d59b7);
    }
    else {
      this_00 = GetField<google::protobuf::internal::ArenaStringPtr>
                          ((Reflection *)
                           CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                           (Message *)in_stack_ffffffffffffffb8,(FieldDescriptor *)0x6d59dc);
      local_10 = internal::ArenaStringPtr::Get_abi_cxx11_(this_00);
    }
  }
  return local_10;
}

Assistant:

const std::string& Reflection::GetStringReference(const Message& message,
                                                  const FieldDescriptor* field,
                                                  std::string* scratch) const {
  USAGE_CHECK_ALL(GetStringReference, SINGULAR, STRING);
  if (field->is_extension()) {
    return GetExtensionSet(message).GetString(field->number(),
                                              field->default_value_string());
  } else {
    switch (field->options().ctype()) {
      default:  // TODO(kenton):  Support other string reps.
      case FieldOptions::STRING: {
        if (IsInlined(field)) {
          return GetField<InlinedStringField>(message, field).GetNoArena();
        }

        return GetField<ArenaStringPtr>(message, field).Get();
      }
    }
  }
}